

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  _Base_ptr *pp_Var1;
  pointer *pppcVar2;
  cmMakefile *mf;
  cmMakefile *makefile;
  pointer ppcVar3;
  pointer ppcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string projectPath;
  string projectType;
  cmXMLWriter xml;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"utf-8");
    pp_Var1 = &cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    cFiles._M_t._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cFiles,"CodeLite_Project","");
    cmXMLWriter::StartElement(&xml,(string *)&cFiles);
    if ((_Base_ptr *)cFiles._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)cFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&cFiles,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"Name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cFiles);
    if ((_Base_ptr *)cFiles._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)cFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    cmXMLWriter::Attribute<char[1]>(&xml,"InternalType",(char (*) [1])0x674b0e);
    projectType._M_dataplus._M_p = (pointer)&projectType.field_2;
    projectType._M_string_length = 0;
    projectType.field_2._M_local_buf[0] = '\0';
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &otherFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppcVar3 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar3 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        makefile = (*ppcVar3)->Makefile;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&targets,&(*ppcVar3)->GeneratorTargets);
        for (ppcVar4 = targets.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppcVar4 !=
            targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
          CollectSourceFiles(&projectPath,this,makefile,*ppcVar4,&cFiles,&otherFiles);
          std::__cxx11::string::operator=((string *)&projectType,(string *)&projectPath);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)projectPath._M_dataplus._M_p != &projectPath.field_2) {
            operator_delete(projectPath._M_dataplus._M_p,
                            projectPath.field_2._M_allocated_capacity + 1);
          }
        }
        if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)targets.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppcVar3 = ppcVar3 + 1;
      } while (ppcVar3 !=
               (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    }
    cmsys::SystemTools::GetFilenamePath(&projectPath,filename);
    pppcVar2 = &targets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targets,"");
    CreateProjectSourceEntries
              (this,&cFiles,&otherFiles,&xml,&projectPath,mf,&projectType,(string *)&targets);
    if (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
      operator_delete(targets.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)targets.
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    cmXMLWriter::EndElement(&xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectPath._M_dataplus._M_p != &projectPath.field_2) {
      operator_delete(projectPath._M_dataplus._M_p,projectPath.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&otherFiles._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~_Rb_tree(&cFiles._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectType._M_dataplus._M_p != &projectType.field_2) {
      operator_delete(projectType._M_dataplus._M_p,
                      CONCAT71(projectType.field_2._M_allocated_capacity._1_7_,
                               projectType.field_2._M_local_buf[0]) + 1);
    }
    cmXMLWriter::~cmXMLWriter(&xml);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  ////////////////////////////////////
  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Project");
  xml.Attribute("Name", lgs[0]->GetProjectName());
  xml.Attribute("InternalType", "");

  std::string projectType;

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an acompanying header, one for all other files
  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;

  for (std::vector<cmLocalGenerator*>::const_iterator lg = lgs.begin();
       lg != lgs.end(); lg++) {
    cmMakefile* makefile = (*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets = (*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++) {
      projectType = CollectSourceFiles(makefile, *ti, cFiles, otherFiles);
    }
  }

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  CreateProjectSourceEntries(cFiles, otherFiles, &xml, projectPath, mf,
                             projectType, "");

  xml.EndElement(); // CodeLite_Project
}